

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

double log(double __x)

{
  FILE *__stream;
  byte bVar1;
  uint uVar2;
  char *in_RSI;
  byte in_DIL;
  double extraout_XMM0_Qa;
  byte local_109;
  type tStack_50;
  pid_t p;
  duration<double,_std::ratio<1L,_1L>_> local_48;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  time_point n;
  va_list args;
  char *fmt_local;
  bool in_child_local;
  
  bVar1 = in_DIL & 1;
  local_109 = 0;
  if (!afl_debug_enabled) {
    local_109 = afl_debug_unicorn_enabled ^ 0xff;
  }
  if ((((local_109 & 1) == 0) && ((bVar1 == 0 || (afl_debug_unicorn_enabled)))) &&
     ((bVar1 != 0 || (afl_debug_enabled)))) {
    fprintf(_stderr,"[u] ");
    if ((afl_debug_enabled & 1U) != 0) {
      local_40.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      __stream = _stderr;
      tStack_50 = std::chrono::operator-(&local_40,&t0);
      local_48.__r = (rep_conflict)
                     std::chrono::
                     duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                               (&stack0xffffffffffffffb0);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_48);
      fprintf(__stream,"[%04.6f] ");
    }
    if ((bVar1 != 0) && ((afl_debug_unicorn_enabled & 1U) != 0)) {
      uVar2 = getpid();
      fprintf(_stderr,"[%04d] ",(ulong)uVar2);
    }
    n.__d.__r._4_4_ = 0x30;
    n.__d.__r._0_4_ = 0x10;
    vfprintf(_stderr,in_RSI,&n);
    __x = extraout_XMM0_Qa;
  }
  return __x;
}

Assistant:

static void log(bool in_child, const char* fmt, ...) {
    va_list args;

    if (likely(!afl_debug_enabled && !afl_debug_unicorn_enabled)) {
        return;
    }

    if (in_child && !afl_debug_unicorn_enabled) {
        return;
    }

    if (!in_child && !afl_debug_enabled) {
        return;
    }

    fprintf(stderr, "[u] ");

    if (afl_debug_enabled) {
        auto n = std::chrono::steady_clock::now();

        fprintf(
            stderr, "[%04.6f] ",
            std::chrono::duration_cast<std::chrono::duration<double>>(n - t0)
                .count());
    }

    if (in_child && afl_debug_unicorn_enabled) {
        pid_t p = getpid();

        fprintf(stderr, "[%04" PRId32 "] ", p);
    }

    va_start(args, fmt);

    vfprintf(stderr, fmt, args);

    va_end(args);
}